

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O2

bool __thiscall
cppcms::anon_unknown_0::
base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
::dispatch(base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
           *this,string *url,char *method,application *param_3)

{
  cmatch *this_00;
  bool bVar1;
  string_type local_90;
  string_type local_70;
  value_type local_50;
  value_type local_38;
  
  bVar1 = option::matches(&this->super_option,url,method);
  if (bVar1) {
    this_00 = &(this->super_option).match_;
    booster::match_results<const_char_*>::operator[](&local_38,this_00,this->select_[0]);
    booster::sub_match<char_const*>::str_abi_cxx11_(&local_70,&local_38);
    booster::match_results<const_char_*>::operator[](&local_50,this_00,this->select_[1]);
    booster::sub_match<char_const*>::str_abi_cxx11_(&local_90,&local_50);
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::operator()(&this->handle_,&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return bVar1;
}

Assistant:

virtual bool dispatch(std::string const &url,char const *method,application *)
			{
				if(matches(url,method)) {
					execute_handler(handle_);
					return true;
				}
				return false;
			}